

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void google::protobuf::internal::MapFieldPrinterHelper::CopyKey
               (MapKey *key,Message *message,FieldDescriptor *field_desc)

{
  bool value;
  int32_t value_00;
  uint32_t value_01;
  uint64_t value_02;
  int64_t value_03;
  Reflection *this;
  Metadata MVar1;
  string_view sVar2;
  string local_58;
  LogMessage local_38;
  
  MVar1 = Message::GetMetadata(message);
  this = MVar1.reflection;
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field_desc->type_ * 4)) {
  case 1:
    value_00 = MapKey::GetInt32Value(key);
    Reflection::SetInt32(this,message,field_desc,value_00);
    return;
  case 2:
    value_03 = MapKey::GetInt64Value(key);
    Reflection::SetInt64(this,message,field_desc,value_03);
    return;
  case 3:
    value_01 = MapKey::GetUInt32Value(key);
    Reflection::SetUInt32(this,message,field_desc,value_01);
    return;
  case 4:
    value_02 = MapKey::GetUInt64Value(key);
    Reflection::SetUInt64(this,message,field_desc,value_02);
    return;
  case 5:
  case 6:
  case 8:
  case 10:
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
               ,0x9db);
    sVar2._M_str = "Not supported.";
    sVar2._M_len = 0xe;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              (&local_38,sVar2);
    absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_38);
    break;
  case 7:
    value = MapKey::GetBoolValue(key);
    Reflection::SetBool(this,message,field_desc,value);
    return;
  case 9:
    sVar2 = MapKey::GetStringValue(key);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,sVar2._M_str,sVar2._M_str + sVar2._M_len);
    Reflection::SetString(this,message,field_desc,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void MapFieldPrinterHelper::CopyKey(const MapKey& key, Message* message,
                                    const FieldDescriptor* field_desc) {
  const Reflection* reflection = message->GetReflection();
  switch (field_desc->cpp_type()) {
    case FieldDescriptor::CPPTYPE_DOUBLE:
    case FieldDescriptor::CPPTYPE_FLOAT:
    case FieldDescriptor::CPPTYPE_ENUM:
    case FieldDescriptor::CPPTYPE_MESSAGE:
      ABSL_LOG(ERROR) << "Not supported.";
      break;
    case FieldDescriptor::CPPTYPE_STRING:
      reflection->SetString(message, field_desc,
                            std::string(key.GetStringValue()));
      return;
    case FieldDescriptor::CPPTYPE_INT64:
      reflection->SetInt64(message, field_desc, key.GetInt64Value());
      return;
    case FieldDescriptor::CPPTYPE_INT32:
      reflection->SetInt32(message, field_desc, key.GetInt32Value());
      return;
    case FieldDescriptor::CPPTYPE_UINT64:
      reflection->SetUInt64(message, field_desc, key.GetUInt64Value());
      return;
    case FieldDescriptor::CPPTYPE_UINT32:
      reflection->SetUInt32(message, field_desc, key.GetUInt32Value());
      return;
    case FieldDescriptor::CPPTYPE_BOOL:
      reflection->SetBool(message, field_desc, key.GetBoolValue());
      return;
  }
}